

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.h
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
date::detail::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,
          time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_(date::detail::classify)4>
          *t)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  uchar uVar2;
  long lVar3;
  basic_ostream<char,_std::char_traits<char>_> bVar4;
  ostream *poVar5;
  char *pcVar6;
  save_stream<char,_std::char_traits<char>_> _;
  char local_31;
  save_stream<char,_std::char_traits<char>_> local_30;
  
  save_stream<char,_std::char_traits<char>_>::save_stream(&local_30,os);
  if ((t->super_time_of_day_base).neg_ == true) {
    local_31 = '-';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,&local_31,1);
  }
  pbVar1 = os + *(long *)(*(long *)os + -0x18);
  if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (basic_ostream<char,_std::char_traits<char>_>)0x0
     ) {
    bVar4 = (basic_ostream<char,_std::char_traits<char>_>)std::ios::widen((char)pbVar1);
    pbVar1[0xe0] = bVar4;
    pbVar1[0xe1] = (basic_ostream<char,_std::char_traits<char>_>)0x1;
  }
  pbVar1[0xe0] = (basic_ostream<char,_std::char_traits<char>_>)0x30;
  lVar3 = *(long *)os;
  *(undefined4 *)(os + *(long *)(lVar3 + -0x18) + 0x18) = 0x82;
  if (1 < (byte)((t->super_time_of_day_base).mode_ - 1)) {
    *(undefined8 *)(os + *(long *)(lVar3 + -0x18) + 0x10) = 2;
  }
  poVar5 = std::ostream::_M_insert<long>((long)os);
  local_31 = ':';
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_31,1);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
  poVar5 = std::ostream::_M_insert<long>((long)os);
  local_31 = ':';
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_31,1);
  operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar5,&t->s_);
  uVar2 = (t->super_time_of_day_base).mode_;
  if (uVar2 == '\x01') {
    pcVar6 = "am";
  }
  else {
    if (uVar2 != '\x02') goto LAB_001081ea;
    pcVar6 = "pm";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar6,2);
LAB_001081ea:
  save_stream<char,_std::char_traits<char>_>::~save_stream(&local_30);
  return os;
}

Assistant:

std::basic_ostream<CharT, Traits>&
    operator<<(std::basic_ostream<CharT, Traits>& os, const time_of_day_storage& t)
    {
        using namespace std;
        detail::save_stream<CharT, Traits> _(os);
        if (t.neg_)
            os << '-';
        os.fill('0');
        os.flags(std::ios::dec | std::ios::right);
        if (t.mode_ != am && t.mode_ != pm)
            os.width(2);
        os << t.h_.count() << ':';
        os.width(2);
        os << t.m_.count() << ':' << t.s_;
        switch (t.mode_)
        {
        case am:
            os << "am";
            break;
        case pm:
            os << "pm";
            break;
        }
        return os;
    }